

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  MessageLite *pMVar2;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar3;
  LogMessage *pLVar4;
  CppType *pCVar5;
  CppType *pCVar6;
  LogMessage local_c0;
  Voidify local_a9;
  CppType local_a8;
  CppType local_a4;
  Nullable<const_char_*> local_a0;
  LogMessage local_98;
  Voidify local_81;
  anon_enum_32 local_80;
  anon_enum_32 local_7c;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_60;
  Voidify local_49;
  CppType local_48;
  CppType local_44;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  MessageLite *prototype_local;
  FieldType type_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)prototype;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,(Extension **)&absl_log_internal_check_op_result)
  ;
  if (bVar1) {
    absl_log_internal_check_op_result[8] = prototype_local._3_1_;
    local_44 = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_44);
    local_48 = CPPTYPE_MESSAGE;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_48);
    local_40 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_40 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_40);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x29b,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    absl_log_internal_check_op_result[9] = '\0';
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfb;
    pMVar2 = MessageLite::New((MessageLite *)descriptor_local,this->arena_);
    *(MessageLite **)absl_log_internal_check_op_result = pMVar2;
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfd;
    this_local = *(ExtensionSet **)absl_log_internal_check_op_result;
  }
  else {
    local_7c = (anon_enum_32)((absl_log_internal_check_op_result[9] & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_7c);
    local_80 = OPTIONAL_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_80);
    local_78 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_78 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_78);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2a3,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    local_a4 = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a4);
    local_a8 = CPPTYPE_MESSAGE;
    pCVar6 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a8);
    local_a0 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar5,pCVar6,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (local_a0 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2a3,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_c0);
    }
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfd;
    if (((byte)absl_log_internal_check_op_result[10] >> 2 & 1) == 0) {
      this_local = *(ExtensionSet **)absl_log_internal_check_op_result;
    }
    else {
      this_local = (ExtensionSet *)
                   (**(code **)(**(long **)absl_log_internal_check_op_result + 0x28))
                             (*(long **)absl_log_internal_check_op_result,descriptor_local,
                              this->arena_);
    }
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->ptr.message_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->MutableMessage(prototype,
                                                              arena_);
    } else {
      return extension->ptr.message_value;
    }
  }
}